

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fCopyImageTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::CopyImageTest::logTestInfoIter(CopyImageTest *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  deUint32 dVar2;
  TestLog *log;
  int iVar3;
  bool bVar4;
  size_t sVar5;
  char *pcVar6;
  ScopedLogSection srcSection;
  size_type __dnew;
  size_type __dnew_1;
  ScopedLogSection section;
  ScopedLogSection local_1e8;
  string local_1e0;
  size_type local_1c0;
  ScopedLogSection local_1b8;
  undefined1 local_1b0 [8];
  _func_int **local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a0 [6];
  ios_base local_138 [264];
  
  log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_1a0[0]._M_allocated_capacity = 0x6573614374736554;
  local_1a0[0]._8_4_ = 0x6f666e49;
  local_1a8 = (_func_int **)0xc;
  local_1a0[0]._M_local_buf[0xc] = '\0';
  paVar1 = &local_1e0.field_2;
  local_1e0.field_2._M_allocated_capacity._0_6_ = 0x632074736554;
  local_1e0.field_2._M_allocated_capacity._6_2_ = 0x7361;
  local_1e0.field_2._8_6_ = 0x6f666e692065;
  local_1e0._M_string_length = 0xe;
  local_1e0.field_2._M_local_buf[0xe] = '\0';
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  local_1b0 = (undefined1  [8])local_1a0;
  tcu::ScopedLogSection::ScopedLogSection(&local_1b8,log,(string *)local_1b0,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT26(local_1e0.field_2._M_allocated_capacity._6_2_,
                             local_1e0.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  local_1b0 = (undefined1  [8])log;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&local_1a8,"Testing copying from ",0x15);
  dVar2 = (this->m_srcImageInfo).m_target;
  if ((int)dVar2 < 0x8513) {
    if (dVar2 == 0xde1) {
      pcVar6 = "texture2d";
      goto LAB_016935ad;
    }
    if (dVar2 == 0x806f) {
      pcVar6 = "texture3d";
      goto LAB_016935ad;
    }
LAB_01693642:
    bVar4 = true;
    pcVar6 = (char *)0x0;
  }
  else {
    if (dVar2 == 0x8513) {
      pcVar6 = "cubemap";
    }
    else if (dVar2 == 0x8c1a) {
      pcVar6 = "texture2d_array";
    }
    else {
      if (dVar2 != 0x8d41) goto LAB_01693642;
      pcVar6 = "renderbuffer";
    }
LAB_016935ad:
    bVar4 = false;
  }
  iVar3 = (int)(ostringstream *)&local_1a8;
  if (bVar4) {
    std::ios::clear(iVar3 + (int)local_1a8[-3]);
  }
  else {
    sVar5 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8," to ",4);
  dVar2 = (this->m_dstImageInfo).m_target;
  if ((int)dVar2 < 0x8513) {
    if (dVar2 == 0xde1) {
      pcVar6 = "texture2d";
    }
    else {
      if (dVar2 != 0x806f) {
LAB_016938cc:
        bVar4 = true;
        pcVar6 = (char *)0x0;
        goto LAB_01693667;
      }
      pcVar6 = "texture3d";
    }
  }
  else if (dVar2 == 0x8513) {
    pcVar6 = "cubemap";
  }
  else if (dVar2 == 0x8c1a) {
    pcVar6 = "texture2d_array";
  }
  else {
    if (dVar2 != 0x8d41) goto LAB_016938cc;
    pcVar6 = "renderbuffer";
  }
  bVar4 = false;
LAB_01693667:
  if (bVar4) {
    std::ios::clear(iVar3 + (int)local_1a8[-3]);
  }
  else {
    sVar5 = strlen(pcVar6);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,pcVar6,sVar5);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1a8,".",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
  std::ios_base::~ios_base(local_138);
  local_1e0._M_dataplus._M_p = (pointer)0x12;
  local_1b0 = (undefined1  [8])local_1a0;
  local_1b0 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_1e0)
  ;
  local_1a0[0]._M_allocated_capacity = local_1e0._M_dataplus._M_p;
  *(undefined8 *)local_1b0 = 0x6920656372756f53;
  *(char *)((long)local_1b0 + 8) = 'm';
  *(char *)((long)local_1b0 + 9) = 'a';
  *(char *)((long)local_1b0 + 10) = 'g';
  *(char *)((long)local_1b0 + 0xb) = 'e';
  *(char *)((long)local_1b0 + 0xc) = ' ';
  *(char *)((long)local_1b0 + 0xd) = 'i';
  *(char *)((long)local_1b0 + 0xe) = 'n';
  *(char *)((long)local_1b0 + 0xf) = 'f';
  *(char *)((long)local_1b0 + 0x10) = 'o';
  *(char *)((long)local_1b0 + 0x11) = '.';
  local_1a8 = (_func_int **)local_1e0._M_dataplus._M_p;
  *(char *)((long)local_1b0 + (long)local_1e0._M_dataplus._M_p) = '\0';
  local_1c0 = 0x12;
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  local_1e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1c0);
  local_1e0.field_2._M_allocated_capacity._0_6_ = (undefined6)local_1c0;
  local_1e0.field_2._M_allocated_capacity._6_2_ = (undefined2)(local_1c0 >> 0x30);
  builtin_strncpy(local_1e0._M_dataplus._M_p,"Source image info.",0x12);
  local_1e0._M_string_length = local_1c0;
  local_1e0._M_dataplus._M_p[local_1c0] = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&local_1e8,log,(string *)local_1b0,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT26(local_1e0.field_2._M_allocated_capacity._6_2_,
                             local_1e0.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  logTestImageInfo(log,&this->m_srcImageInfo);
  tcu::TestLog::endSection(local_1e8.m_log);
  local_1e0._M_dataplus._M_p = (pointer)0x17;
  local_1b0 = (undefined1  [8])local_1a0;
  local_1b0 = (undefined1  [8])std::__cxx11::string::_M_create((ulong *)local_1b0,(ulong)&local_1e0)
  ;
  local_1a0[0]._M_allocated_capacity = local_1e0._M_dataplus._M_p;
  *(undefined8 *)local_1b0 = 0x74616e6974736544;
  *(char *)((long)local_1b0 + 8) = 'i';
  *(char *)((long)local_1b0 + 9) = 'o';
  *(char *)((long)local_1b0 + 10) = 'n';
  *(char *)((long)local_1b0 + 0xb) = ' ';
  *(char *)((long)local_1b0 + 0xc) = 'i';
  *(char *)((long)local_1b0 + 0xd) = 'm';
  *(char *)((long)local_1b0 + 0xe) = 'a';
  *(char *)((long)local_1b0 + 0xf) = 'g';
  *(char *)((long)local_1b0 + 0xf) = 'g';
  *(char *)((long)local_1b0 + 0x10) = 'e';
  *(char *)((long)local_1b0 + 0x11) = ' ';
  *(char *)((long)local_1b0 + 0x12) = 'i';
  *(char *)((long)local_1b0 + 0x13) = 'n';
  *(char *)((long)local_1b0 + 0x14) = 'f';
  *(char *)((long)local_1b0 + 0x15) = 'o';
  *(char *)((long)local_1b0 + 0x16) = '.';
  local_1a8 = (_func_int **)local_1e0._M_dataplus._M_p;
  *(char *)((long)local_1b0 + (long)local_1e0._M_dataplus._M_p) = '\0';
  local_1c0 = 0x17;
  local_1e0._M_dataplus._M_p = (pointer)paVar1;
  local_1e0._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_1e0,(ulong)&local_1c0);
  local_1e0.field_2._M_allocated_capacity._0_6_ = (undefined6)local_1c0;
  local_1e0.field_2._M_allocated_capacity._6_2_ = (undefined2)(local_1c0 >> 0x30);
  builtin_strncpy(local_1e0._M_dataplus._M_p,"Destination image info.",0x17);
  local_1e0._M_string_length = local_1c0;
  local_1e0._M_dataplus._M_p[local_1c0] = '\0';
  tcu::ScopedLogSection::ScopedLogSection(&local_1e8,log,(string *)local_1b0,&local_1e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e0._M_dataplus._M_p,
                    CONCAT26(local_1e0.field_2._M_allocated_capacity._6_2_,
                             local_1e0.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if (local_1b0 != (undefined1  [8])local_1a0) {
    operator_delete((void *)local_1b0,local_1a0[0]._M_allocated_capacity + 1);
  }
  logTestImageInfo(log,&this->m_dstImageInfo);
  tcu::TestLog::endSection(local_1e8.m_log);
  tcu::TestLog::endSection(local_1b8.m_log);
  return;
}

Assistant:

void CopyImageTest::logTestInfoIter (void)
{
	TestLog& log = m_testCtx.getLog();

	logTestInfo(log, m_srcImageInfo, m_dstImageInfo);
}